

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlURLInputStream.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::CurlURLInputStream::CurlURLInputStream
          (CurlURLInputStream *this,XMLURL *urlSource,XMLNetHTTPInfo *httpInfo)

{
  XMLByte *pXVar1;
  char *pcVar2;
  XMLCh *chars;
  XMLCh *chars_00;
  int iVar3;
  CURLM *pCVar4;
  CURL *pCVar5;
  uchar *puVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  curl_slist *pcVar7;
  XMLSize_t length;
  char16_t *pcVar8;
  undefined8 uVar9;
  char *__src;
  long lVar10;
  char *pcVar11;
  XMLBuffer userPassBuf;
  char *contentType8;
  TranscodeToStr url;
  XMLBuffer local_a8;
  TranscodeToStr local_70;
  TranscodeToStr local_50;
  
  BinInputStream::BinInputStream(&this->super_BinInputStream);
  (this->super_BinInputStream)._vptr_BinInputStream =
       (_func_int **)&PTR__CurlURLInputStream_0041c910;
  this->fMulti = (CURLM *)0x0;
  this->fEasy = (CURL *)0x0;
  this->fHeadersList = (curl_slist *)0x0;
  this->fMemoryManager = urlSource->fMemoryManager;
  XMLURL::XMLURL(&this->fURLSource,urlSource);
  pXVar1 = this->fBuffer;
  this->fBytesRead = 0;
  this->fBytesToRead = 0;
  this->fTotalBytesRead = 0;
  this->fWritePtr = (XMLByte *)0x0;
  this->fDataAvailable = false;
  this->fBufferHeadPtr = pXVar1;
  this->fBufferTailPtr = pXVar1;
  this->fPayload = (char *)0x0;
  this->fPayloadLen = 0;
  this->fContentType = (XMLCh *)0x0;
  pCVar4 = (CURLM *)curl_multi_init();
  this->fMulti = pCVar4;
  pCVar5 = (CURL *)curl_easy_init();
  this->fEasy = pCVar5;
  if ((this->fURLSource).fURLText == (XMLCh *)0x0) {
    XMLURL::buildFullText(&this->fURLSource);
  }
  TranscodeToStr::TranscodeToStr
            (&local_50,(this->fURLSource).fURLText,"ISO8859-1",this->fMemoryManager);
  pCVar5 = this->fEasy;
  puVar6 = ArrayJanitor<unsigned_char>::get(&local_50.fString);
  curl_easy_setopt(pCVar5,0x2712,puVar6);
  curl_easy_setopt(this->fEasy,0x2711,this);
  curl_easy_setopt(this->fEasy,0x4e2b,staticWriteCallback);
  curl_easy_setopt(this->fEasy,0x34,1);
  curl_easy_setopt(this->fEasy,0x44,6);
  chars = urlSource->fPassword;
  chars_00 = urlSource->fUser;
  if (chars != (XMLCh *)0x0 && chars_00 != (XMLCh *)0x0) {
    local_a8.fMemoryManager = this->fMemoryManager;
    local_a8.fIndex = 0;
    local_a8.fCapacity = 0x100;
    local_a8.fFullSize = 0;
    local_a8.fUsed = false;
    local_a8.fFullHandler = (XMLBufferFullHandler *)0x0;
    local_a8.fBuffer = (XMLCh *)0x0;
    iVar3 = (*(local_a8.fMemoryManager)->_vptr_MemoryManager[3])(local_a8.fMemoryManager,0x202);
    local_a8.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar3);
    *local_a8.fBuffer = L'\0';
    XMLBuffer::append(&local_a8,chars_00);
    if (local_a8.fIndex == local_a8.fCapacity) {
      XMLBuffer::ensureCapacity(&local_a8,1);
    }
    local_a8.fBuffer[local_a8.fIndex] = L':';
    local_a8.fIndex = (XMLSize_t)((long)(_func_int ***)local_a8.fIndex + 1);
    XMLBuffer::append(&local_a8,chars);
    local_a8.fBuffer[local_a8.fIndex] = L'\0';
    TranscodeToStr::TranscodeToStr(&local_70,local_a8.fBuffer,"ISO8859-1",this->fMemoryManager);
    curl_easy_setopt(this->fEasy,0x6b,0xffffffffffffffef);
    pCVar5 = this->fEasy;
    puVar6 = ArrayJanitor<unsigned_char>::get(&local_70.fString);
    curl_easy_setopt(pCVar5,0x2715,puVar6);
    TranscodeToStr::~TranscodeToStr(&local_70);
    (*(local_a8.fMemoryManager)->_vptr_MemoryManager[4])(local_a8.fMemoryManager,local_a8.fBuffer);
  }
  if (httpInfo == (XMLNetHTTPInfo *)0x0) goto LAB_00347d53;
  if (*(int *)httpInfo == 1) {
    uVar9 = 0x2e;
LAB_00347c02:
    curl_easy_setopt(this->fEasy,uVar9,1);
  }
  else if (*(int *)httpInfo == 2) {
    uVar9 = 0x2f;
    goto LAB_00347c02;
  }
  __src = *(char **)(httpInfo + 8);
  if (__src != (char *)0x0) {
    if (0 < *(long *)(httpInfo + 0x10)) {
      pcVar11 = __src + *(long *)(httpInfo + 0x10);
      do {
        lVar10 = 1;
        while (((__src[lVar10 + -1] != '\r' || (pcVar11 <= __src + lVar10)) ||
               (__src[lVar10] != '\n'))) {
          pcVar2 = __src + lVar10;
          lVar10 = lVar10 + 1;
          if (pcVar11 <= pcVar2) goto LAB_00347cde;
        }
        iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar10);
        local_a8.fIndex = CONCAT44(extraout_var_00,iVar3);
        local_a8.fCapacity = (XMLSize_t)this->fMemoryManager;
        memcpy((void *)local_a8.fIndex,__src,lVar10 - 1);
        *(undefined1 *)(local_a8.fIndex + lVar10 + -1) = 0;
        pcVar7 = (curl_slist *)curl_slist_append(this->fHeadersList,local_a8.fIndex);
        this->fHeadersList = pcVar7;
        if ((void *)local_a8.fIndex != (void *)0x0) {
          if ((MemoryManager *)local_a8.fCapacity == (MemoryManager *)0x0) {
            operator_delete__((void *)local_a8.fIndex);
          }
          else {
            (*(*(_func_int ***)local_a8.fCapacity)[4])();
          }
        }
        __src = __src + lVar10 + 1;
      } while (__src < pcVar11);
    }
LAB_00347cde:
    curl_easy_setopt(this->fEasy,0x2727,this->fHeadersList);
  }
  if (*(char **)(httpInfo + 0x18) != (char *)0x0) {
    this->fPayload = *(char **)(httpInfo + 0x18);
    this->fPayloadLen = *(XMLSize_t *)(httpInfo + 0x20);
    curl_easy_setopt(this->fEasy,0x2719,this);
    curl_easy_setopt(this->fEasy,0x4e2c,staticReadCallback);
    curl_easy_setopt(this->fEasy,0x75a3,this->fPayloadLen);
  }
LAB_00347d53:
  curl_multi_add_handle(this->fMulti,this->fEasy);
  if (this->fBufferHeadPtr == pXVar1) {
    do {
      local_a8.fIndex = local_a8.fIndex & 0xffffffff00000000;
      readMore(this,(int *)&local_a8);
      if ((int)local_a8.fIndex == 0) break;
    } while (this->fBufferHeadPtr == pXVar1);
  }
  local_70.fString.fData = (XMLByte *)0x0;
  curl_easy_getinfo(this->fEasy,0x100012);
  puVar6 = local_70.fString.fData;
  if (local_70.fString.fData != (XMLByte *)0x0) {
    length = XMLString::stringLen((char *)local_70.fString.fData);
    TranscodeFromStr::TranscodeFromStr
              ((TranscodeFromStr *)&local_a8,puVar6,length,"ISO8859-1",this->fMemoryManager);
    local_a8.fFullSize = 0;
    pcVar8 = ArrayJanitor<char16_t>::release((ArrayJanitor<char16_t> *)&local_a8);
    this->fContentType = pcVar8;
    TranscodeFromStr::~TranscodeFromStr((TranscodeFromStr *)&local_a8);
  }
  TranscodeToStr::~TranscodeToStr(&local_50);
  return;
}

Assistant:

CurlURLInputStream::CurlURLInputStream(const XMLURL& urlSource, const XMLNetHTTPInfo* httpInfo/*=0*/)
      : fMulti(0)
      , fEasy(0)
      , fHeadersList(0)
      , fMemoryManager(urlSource.getMemoryManager())
      , fURLSource(urlSource)
      , fTotalBytesRead(0)
      , fWritePtr(0)
      , fBytesRead(0)
      , fBytesToRead(0)
      , fDataAvailable(false)
      , fBufferHeadPtr(fBuffer)
      , fBufferTailPtr(fBuffer)
      , fPayload(0)
      , fPayloadLen(0)
      , fContentType(0)
{
    // Allocate the curl multi handle
    fMulti = curl_multi_init();

    // Allocate the curl easy handle
    fEasy = curl_easy_init();

    // Set URL option
    TranscodeToStr url(fURLSource.getURLText(), "ISO8859-1", fMemoryManager);
    curl_easy_setopt(fEasy, CURLOPT_URL, (char*)url.str());

    // Set up a way to recieve the data
    curl_easy_setopt(fEasy, CURLOPT_WRITEDATA, this);						// Pass this pointer to write function
    curl_easy_setopt(fEasy, CURLOPT_WRITEFUNCTION, staticWriteCallback);	// Our static write function

    // Do redirects
    curl_easy_setopt(fEasy, CURLOPT_FOLLOWLOCATION, (long)1);
    curl_easy_setopt(fEasy, CURLOPT_MAXREDIRS, (long)6);

    // Add username and password if authentication is required
    const XMLCh *username = urlSource.getUser();
    const XMLCh *password = urlSource.getPassword();
    if(username && password) {
        XMLBuffer userPassBuf(256, fMemoryManager);
        userPassBuf.append(username);
        userPassBuf.append(chColon);
        userPassBuf.append(password);

        TranscodeToStr userPass(userPassBuf.getRawBuffer(), "ISO8859-1", fMemoryManager);

        curl_easy_setopt(fEasy, CURLOPT_HTTPAUTH, (long)CURLAUTH_ANY);
        curl_easy_setopt(fEasy, CURLOPT_USERPWD, (char*)userPass.str());
    }

    if(httpInfo) {
        // Set the correct HTTP method
        switch(httpInfo->fHTTPMethod) {
        case XMLNetHTTPInfo::GET:
            break;
        case XMLNetHTTPInfo::PUT:
            curl_easy_setopt(fEasy, CURLOPT_UPLOAD, (long)1);
            break;
        case XMLNetHTTPInfo::POST:
            curl_easy_setopt(fEasy, CURLOPT_POST, (long)1);
            break;
        }

        // Add custom headers
        if(httpInfo->fHeaders) {
            const char *headersBuf = httpInfo->fHeaders;
            const char *headersBufEnd = httpInfo->fHeaders + httpInfo->fHeadersLen;

            const char *headerStart = headersBuf;
            while(headersBuf < headersBufEnd) {
                if(*headersBuf == '\r' && (headersBuf + 1) < headersBufEnd &&
                   *(headersBuf + 1) == '\n') {

                    XMLSize_t length = headersBuf - headerStart;
                    ArrayJanitor<char> header((char*)fMemoryManager->allocate((length + 1) * sizeof(char)),
                                              fMemoryManager);
                    memcpy(header.get(), headerStart, length);
                    header.get()[length] = 0;

                    fHeadersList = curl_slist_append(fHeadersList, header.get());

                    headersBuf += 2;
                    headerStart = headersBuf;
                    continue;
                }
                ++headersBuf;
            }
            curl_easy_setopt(fEasy, CURLOPT_HTTPHEADER, fHeadersList);
        }

        // Set up the payload
        if(httpInfo->fPayload) {
            fPayload = httpInfo->fPayload;
            fPayloadLen = httpInfo->fPayloadLen;
            curl_easy_setopt(fEasy, CURLOPT_READDATA, this);
            curl_easy_setopt(fEasy, CURLOPT_READFUNCTION, staticReadCallback);
            curl_easy_setopt(fEasy, CURLOPT_INFILESIZE_LARGE, (curl_off_t)fPayloadLen);
        }
    }

    // Add easy handle to the multi stack
    curl_multi_add_handle(fMulti, fEasy);

    // Start reading, to get the content type
    while(fBufferHeadPtr == fBuffer)
    {
    	int runningHandles = 0;
        try
        {
            readMore(&runningHandles);
        }
        catch(const MalformedURLException&)
        {
            cleanup();
            throw;
        }
        catch(const NetAccessorException&)
        {
            cleanup();
            throw;
        }
    	if(runningHandles == 0) break;
    }

    // Find the content type
    char *contentType8 = 0;
    curl_easy_getinfo(fEasy, CURLINFO_CONTENT_TYPE, &contentType8);
    if(contentType8)
        fContentType = TranscodeFromStr((XMLByte*)contentType8, XMLString::stringLen(contentType8), "ISO8859-1", fMemoryManager).adopt();
}